

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O3

bool __thiscall
MultiSigningProvider::GetTaprootSpendData
          (MultiSigningProvider *this,XOnlyPubKey *output_key,TaprootSpendData *spenddata)

{
  long lVar1;
  pointer puVar2;
  pointer puVar3;
  SigningProvider *pSVar4;
  char cVar5;
  int iVar6;
  pointer puVar7;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  puVar2 = (this->m_providers).
           super__Vector_base<std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>,_std::allocator<std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (this->m_providers).
           super__Vector_base<std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>,_std::allocator<std::unique_ptr<SigningProvider,_std::default_delete<SigningProvider>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar2 == puVar3) {
    cVar5 = '\0';
  }
  else {
    do {
      puVar7 = puVar2 + 1;
      pSVar4 = (puVar2->_M_t).
               super___uniq_ptr_impl<SigningProvider,_std::default_delete<SigningProvider>_>._M_t.
               super__Tuple_impl<0UL,_SigningProvider_*,_std::default_delete<SigningProvider>_>.
               super__Head_base<0UL,_SigningProvider_*,_false>._M_head_impl;
      iVar6 = (*pSVar4->_vptr_SigningProvider[8])(pSVar4,output_key,spenddata);
      cVar5 = (char)iVar6;
      if (cVar5 != '\0') break;
      puVar2 = puVar7;
    } while (puVar7 != puVar3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (bool)cVar5;
}

Assistant:

bool MultiSigningProvider::GetTaprootSpendData(const XOnlyPubKey& output_key, TaprootSpendData& spenddata) const
{
    for (const auto& provider: m_providers) {
        if (provider->GetTaprootSpendData(output_key, spenddata)) return true;
    }
    return false;
}